

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void handle_text_frame(cio_websocket *websocket,uint8_t *data,uint64_t length,_Bool last_frame)

{
  uint8_t uVar1;
  bool bVar2;
  bool local_37;
  _Bool last_chunk;
  cio_utf8_status status;
  size_t len;
  _Bool last_frame_local;
  uint64_t length_local;
  uint8_t *data_local;
  cio_websocket *websocket_local;
  
  uVar1 = cio_check_utf8(&(websocket->ws_private).utf8_state,data,length);
  local_37 = true;
  if (uVar1 != '\f') {
    local_37 = last_frame && uVar1 != '\0';
  }
  if (local_37) {
    handle_error(websocket,CIO_PROTOCOL_NOT_SUPPORTED,CIO_WEBSOCKET_CLOSE_UNSUPPORTED_DATA,
                 "payload not valid utf8");
  }
  else {
    bVar2 = (websocket->ws_private).remaining_read_frame_length == 0;
    if (last_frame) {
      cio_utf8_init(&(websocket->ws_private).utf8_state);
    }
    if (!bVar2) {
      cio_websocket_correct_mask((websocket->ws_private).received_mask,length);
    }
    (*(websocket->ws_private).read_handler)
              (websocket,(websocket->ws_private).read_handler_context,CIO_SUCCESS,
               (websocket->ws_private).read_frame_length,data,length,bVar2,last_frame,false);
  }
  return;
}

Assistant:

static void handle_text_frame(struct cio_websocket *websocket, uint8_t *data, uint64_t length, bool last_frame)
{
	size_t len = (size_t)length;

	enum cio_utf8_status status = cio_check_utf8(&websocket->ws_private.utf8_state, data, len);

	if (cio_unlikely((status == CIO_UTF8_REJECT) || (last_frame && (status != CIO_UTF8_ACCEPT)))) {
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_UNSUPPORTED_DATA, "payload not valid utf8");
		return;
	}

	bool last_chunk = (websocket->ws_private.remaining_read_frame_length == 0);

	if (last_frame) {
		cio_utf8_init(&websocket->ws_private.utf8_state);
	}

	if (!last_chunk) {
		cio_websocket_correct_mask(websocket->ws_private.received_mask, len);
	}

	websocket->ws_private.read_handler(websocket, websocket->ws_private.read_handler_context, CIO_SUCCESS, websocket->ws_private.read_frame_length, data, len, last_chunk, last_frame, false);
}